

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O1

void initMatchList(Abc_Ntk_t *pNtk,Vec_Int_t **iDep,Vec_Int_t **oDep,Vec_Int_t **iMatch,
                  int *iLastItem,Vec_Int_t **oMatch,int *oLastItem,int *iGroup,int *oGroup,
                  int p_equivalence)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  bool bVar5;
  void *pvVar6;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  
  if (p_equivalence == 0) {
    uVar1 = pNtk->vPis->nSize;
    pvVar6 = malloc((long)(int)uVar1 * 8 + 8);
    if (-1 < (long)(int)uVar1) {
      lVar9 = 0;
      do {
        puVar7 = (undefined8 *)malloc(0x10);
        *puVar7 = 0;
        puVar7[1] = 0;
        *(undefined8 **)((long)pvVar6 + lVar9 * 8) = puVar7;
        lVar9 = lVar9 + 1;
      } while ((ulong)uVar1 + 1 != lVar9);
    }
    if (0 < pNtk->vPos->nSize) {
      lVar9 = 0;
      do {
        Vec_IntPush(*(Vec_Int_t **)((long)pvVar6 + (long)oDep[lVar9]->nSize * 8),(int)lVar9);
        lVar9 = lVar9 + 1;
      } while (lVar9 < pNtk->vPos->nSize);
    }
    if (pNtk->vPis->nSize < 0) {
      iVar10 = 0;
    }
    else {
      iVar10 = 0;
      lVar9 = 0;
      do {
        pVVar3 = *(Vec_Int_t **)((long)pvVar6 + lVar9 * 8);
        if (pVVar3->nSize == 0) {
          if (pVVar3->pArray != (int *)0x0) {
            free(pVVar3->pArray);
            pVVar3->pArray = (int *)0x0;
          }
          if (pVVar3 != (Vec_Int_t *)0x0) {
            free(pVVar3);
          }
        }
        else {
          oMatch[iVar10] = pVVar3;
          if (0 < pVVar3->nSize) {
            piVar4 = pVVar3->pArray;
            lVar8 = 0;
            do {
              oGroup[piVar4[lVar8]] = iVar10;
              lVar8 = lVar8 + 1;
            } while (lVar8 < pVVar3->nSize);
          }
          iVar10 = iVar10 + 1;
        }
        bVar5 = lVar9 < pNtk->vPis->nSize;
        lVar9 = lVar9 + 1;
      } while (bVar5);
    }
    *oLastItem = iVar10;
    if (pvVar6 != (void *)0x0) {
      free(pvVar6);
    }
  }
  else if (0 < pNtk->vPos->nSize) {
    lVar9 = 0;
    do {
      Vec_IntPush(oMatch[lVar9],(int)lVar9);
      oGroup[lVar9] = (int)lVar9;
      pVVar2 = pNtk->vPos;
      *oLastItem = pVVar2->nSize;
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar2->nSize);
  }
  uVar1 = pNtk->vPos->nSize;
  pvVar6 = malloc((long)(int)uVar1 * 8 + 8);
  if (-1 < (long)(int)uVar1) {
    lVar9 = 0;
    do {
      puVar7 = (undefined8 *)malloc(0x10);
      *puVar7 = 0;
      puVar7[1] = 0;
      *(undefined8 **)((long)pvVar6 + lVar9 * 8) = puVar7;
      lVar9 = lVar9 + 1;
    } while ((ulong)uVar1 + 1 != lVar9);
  }
  if (0 < pNtk->vPis->nSize) {
    lVar9 = 0;
    do {
      Vec_IntPush(*(Vec_Int_t **)((long)pvVar6 + (long)iDep[lVar9]->nSize * 8),(int)lVar9);
      lVar9 = lVar9 + 1;
    } while (lVar9 < pNtk->vPis->nSize);
  }
  if (pNtk->vPos->nSize < 0) {
    iVar10 = 0;
  }
  else {
    iVar10 = 0;
    lVar9 = 0;
    do {
      pVVar3 = *(Vec_Int_t **)((long)pvVar6 + lVar9 * 8);
      if (pVVar3->nSize == 0) {
        if (pVVar3->pArray != (int *)0x0) {
          free(pVVar3->pArray);
          pVVar3->pArray = (int *)0x0;
        }
        if (pVVar3 != (Vec_Int_t *)0x0) {
          free(pVVar3);
        }
      }
      else {
        iMatch[iVar10] = pVVar3;
        if (0 < pVVar3->nSize) {
          piVar4 = pVVar3->pArray;
          lVar8 = 0;
          do {
            iGroup[piVar4[lVar8]] = iVar10;
            lVar8 = lVar8 + 1;
          } while (lVar8 < pVVar3->nSize);
        }
        iVar10 = iVar10 + 1;
      }
      bVar5 = lVar9 < pNtk->vPos->nSize;
      lVar9 = lVar9 + 1;
    } while (bVar5);
  }
  *iLastItem = iVar10;
  if (pvVar6 == (void *)0x0) {
    return;
  }
  free(pvVar6);
  return;
}

Assistant:

void initMatchList(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** oDep, Vec_Int_t** iMatch, int* iLastItem, Vec_Int_t** oMatch, int* oLastItem, int* iGroup, int* oGroup, int p_equivalence)
{
    int i, j, curr;
    Vec_Int_t** temp;

    if(!p_equivalence) {
        temp = ABC_ALLOC( Vec_Int_t*, Abc_NtkPiNum(pNtk)+1);

        for(i = 0; i < Abc_NtkPiNum(pNtk)+1; i++)    
            temp[i] = Vec_IntAlloc( 0 );    

        for(i = 0; i < Abc_NtkPoNum(pNtk); i++)        
            Vec_IntPush(temp[Vec_IntSize(oDep[i])], i);

        curr = 0;
        for(i = 0; i < Abc_NtkPiNum(pNtk)+1; i++)
        {
            if(Vec_IntSize(temp[i]) == 0)
                Vec_IntFree( temp[i] );

            else
            {
                oMatch[curr] = temp[i];
                
                for(j = 0; j < Vec_IntSize(temp[i]); j++)
                    oGroup[Vec_IntEntry(oMatch[curr], j)] = curr;
            
                curr++;
            }
        }

        *oLastItem = curr;

        ABC_FREE( temp );
    }
    else {
        // the else part fixes the outputs for P-equivalence checking
        for(i = 0; i < Abc_NtkPoNum(pNtk); i++)
        {
            Vec_IntPush(oMatch[i], i);
            oGroup[i] = i;
            (*oLastItem) = Abc_NtkPoNum(pNtk);
        }
    }
        
    /*for(j = 0; j < *oLastItem; j++)
    {
        printf("oMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(oMatch[j]); i++)
            printf("%d ", Vec_IntEntry(oMatch[j], i));
        printf("\n");
    }

    for(i = 0; i < Abc_NtkPoNum(pNtk); i++)
        printf("%d: %d ", i, oGroup[i]);*/

    //////////////////////////////////////////////////////////////////////////////

    temp = ABC_ALLOC( Vec_Int_t*, Abc_NtkPoNum(pNtk)+1 );

    for(i = 0; i < Abc_NtkPoNum(pNtk)+1; i++)    
        temp[i] = Vec_IntAlloc( 0 );

    for(i = 0; i < Abc_NtkPiNum(pNtk); i++)        
        Vec_IntPush(temp[Vec_IntSize(iDep[i])], i);

    curr = 0;
    for(i = 0; i < Abc_NtkPoNum(pNtk)+1; i++)
    {
        if(Vec_IntSize(temp[i]) == 0)
            Vec_IntFree( temp[i] );
        else
        {
            iMatch[curr] = temp[i];
            for(j = 0; j < Vec_IntSize(iMatch[curr]); j++)
                iGroup[Vec_IntEntry(iMatch[curr], j)] = curr;
            curr++;
        }        
    }

    *iLastItem = curr;

    ABC_FREE( temp );        

    /*printf("\n");
    for(j = 0; j < *iLastItem; j++)
    {
        printf("iMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(iMatch[j]); i++)
            printf("%d ", Vec_IntEntry(iMatch[j], i));
        printf("\n");
    }

    for(i = 0; i < Abc_NtkPiNum(pNtk); i++)
        printf("%d: %d ", i, iGroup[i]);
    printf("\n");*/
}